

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O0

_Bool build_decode_table(u32 *decode_table,u8 *lens,uint num_syms,u32 *decode_results,
                        uint table_bits,uint max_codeword_len,u16 *sorted_syms,uint *table_bits_ret)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  long in_RCX;
  ushort *puVar6;
  uint in_EDX;
  long in_RSI;
  void *in_RDI;
  uint in_R8D;
  uint in_R9D;
  bool bVar7;
  ushort *in_stack_00000008;
  uint bit_1;
  uint stride;
  uint i_1;
  u32 entry_1;
  uint bit;
  uint i;
  u32 entry;
  uint subtable_bits;
  uint subtable_start;
  uint subtable_prefix;
  uint cur_table_end;
  u32 codespace_used;
  uint count;
  uint len;
  uint codeword;
  uint sym;
  uint offsets [16];
  uint len_counts [16];
  uint local_130;
  uint local_120;
  uint local_114;
  int local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8 [16];
  uint local_a8 [16];
  uint local_68;
  uint local_64;
  long local_60;
  uint local_54;
  long local_50;
  void *local_48;
  _Bool local_39;
  int local_38;
  uint local_34;
  long local_30;
  uint local_28;
  uint local_24;
  long local_20;
  uint local_8;
  uint local_4;
  
  local_68 = in_R9D;
  local_64 = in_R8D;
  local_60 = in_RCX;
  local_54 = in_EDX;
  local_50 = in_RSI;
  local_48 = in_RDI;
  for (local_f4 = 0; local_f4 <= local_68; local_f4 = local_f4 + 1) {
    local_a8[local_f4] = 0;
  }
  for (local_ec = 0; local_ec < local_54; local_ec = local_ec + 1) {
    local_a8[*(byte *)(local_50 + (ulong)local_ec)] =
         local_a8[*(byte *)(local_50 + (ulong)local_ec)] + 1;
  }
  while( true ) {
    bVar7 = false;
    if (1 < local_68) {
      bVar7 = local_a8[local_68] == 0;
    }
    if (!bVar7) break;
    local_68 = local_68 - 1;
  }
  if (_bit_1 != (uint *)0x0) {
    if (local_68 < local_64) {
      local_130 = local_68;
    }
    else {
      local_130 = local_64;
    }
    local_64 = local_130;
    *_bit_1 = local_130;
  }
  local_e8[0] = 0;
  local_e8[1] = local_a8[0];
  local_fc = 0;
  for (local_f4 = 1; local_f4 < local_68; local_f4 = local_f4 + 1) {
    local_e8[local_f4 + 1] = local_e8[local_f4] + local_a8[local_f4];
    local_fc = local_fc * 2 + local_a8[local_f4];
  }
  uVar4 = local_fc * 2 + local_a8[local_f4];
  for (local_ec = 0; local_ec < local_54; local_ec = local_ec + 1) {
    uVar1 = local_e8[*(byte *)(local_50 + (ulong)local_ec)];
    local_e8[*(byte *)(local_50 + (ulong)local_ec)] = uVar1 + 1;
    *(short *)((long)in_stack_00000008 + (ulong)uVar1 * 2) = (short)local_ec;
  }
  in_stack_00000008 = (ushort *)((long)in_stack_00000008 + (ulong)local_e8[0] * 2);
  bVar5 = (byte)local_68;
  if ((uint)(1 << (bVar5 & 0x1f)) < uVar4) {
    local_39 = false;
  }
  else if (uVar4 < (uint)(1 << (bVar5 & 0x1f))) {
    if (uVar4 == 0) {
      local_ec = 0;
    }
    else {
      if ((uVar4 != 1 << (bVar5 - 1 & 0x1f)) || (local_a8[1] != 1)) {
        return false;
      }
      local_ec = (uint)*in_stack_00000008;
    }
    iVar2 = *(int *)(local_60 + (ulong)local_ec * 4);
    for (local_114 = 0; local_114 < (uint)(1 << ((byte)local_64 & 0x1f)); local_114 = local_114 + 1)
    {
      *(int *)((long)local_48 + (ulong)local_114 * 4) = iVar2 + 0x101;
    }
    local_39 = true;
  }
  else {
    local_f0 = 0;
    for (local_f4 = 1; local_f8 = local_a8[local_f4], local_f8 == 0; local_f4 = local_f4 + 1) {
    }
    local_100 = 1 << ((byte)local_f4 & 0x1f);
    while (local_f4 <= local_64) {
      do {
        puVar6 = in_stack_00000008 + 1;
        local_20 = local_60;
        local_24 = (uint)*in_stack_00000008;
        local_28 = local_f4;
        *(uint *)((long)local_48 + (ulong)local_f0 * 4) =
             *(int *)(local_60 + (ulong)(uint)*in_stack_00000008 * 4) + local_f4 * 0x101;
        if (local_f0 == local_100 - 1) {
          for (; local_f4 < local_64; local_f4 = local_f4 + 1) {
            memcpy((void *)((long)local_48 + (ulong)local_100 * 4),local_48,(ulong)local_100 << 2);
            local_100 = local_100 << 1;
          }
          return true;
        }
        local_4 = local_f0 ^ local_100 - 1;
        iVar2 = 0x1f;
        if (local_4 != 0) {
          for (; local_4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar4 = 1 << (0x1f - ((byte)iVar2 ^ 0x1f) & 0x1f);
        local_f0 = uVar4 | uVar4 - 1 & local_f0;
        local_f8 = local_f8 - 1;
        in_stack_00000008 = puVar6;
      } while (local_f8 != 0);
      do {
        local_f4 = local_f4 + 1;
        if (local_f4 <= local_64) {
          memcpy((void *)((long)local_48 + (ulong)local_100 * 4),local_48,(ulong)local_100 << 2);
          local_100 = local_100 << 1;
        }
        local_f8 = local_a8[local_f4];
      } while (local_f8 == 0);
    }
    bVar5 = (byte)local_64;
    local_100 = 1 << (bVar5 & 0x1f);
    local_104 = 0xffffffff;
    local_108 = 0;
    while( true ) {
      if ((local_f0 & (1 << (bVar5 & 0x1f)) - 1U) != local_104) {
        local_104 = local_f0 & (1 << (bVar5 & 0x1f)) - 1U;
        local_108 = local_100;
        local_10c = local_f4 - local_64;
        for (local_fc = local_f8; local_fc < (uint)(1 << ((byte)local_10c & 0x1f));
            local_fc = local_fc * 2 + local_a8[local_64 + local_10c]) {
          local_10c = local_10c + 1;
        }
        *(uint *)((long)local_48 + (ulong)local_104 * 4) =
             local_100 << 0x10 | 0xc000 | local_10c << 8 | local_64;
        local_100 = local_100 + (1 << ((byte)local_10c & 0x1f));
      }
      puVar6 = in_stack_00000008 + 1;
      local_30 = local_60;
      local_34 = (uint)*in_stack_00000008;
      local_38 = local_f4 - local_64;
      iVar2 = *(int *)(local_60 + (ulong)(uint)*in_stack_00000008 * 4);
      local_120 = local_108 + (local_f0 >> (bVar5 & 0x1f));
      bVar3 = (byte)local_f4;
      do {
        *(uint *)((long)local_48 + (ulong)local_120 * 4) = iVar2 + (local_f4 - local_64) * 0x101;
        local_120 = (1 << (bVar3 - bVar5 & 0x1f)) + local_120;
      } while (local_120 < local_100);
      if (local_f0 == (1 << (bVar3 & 0x1f)) - 1U) break;
      local_8 = local_f0 ^ (1 << (bVar3 & 0x1f)) - 1U;
      iVar2 = 0x1f;
      if (local_8 != 0) {
        for (; local_8 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar4 = 1 << (0x1f - ((byte)iVar2 ^ 0x1f) & 0x1f);
      local_f0 = uVar4 | uVar4 - 1 & local_f0;
      local_f8 = local_f8 - 1;
      while (in_stack_00000008 = puVar6, local_f8 == 0) {
        local_f4 = local_f4 + 1;
        local_f8 = local_a8[local_f4];
      }
    }
    local_39 = true;
  }
  return local_39;
}

Assistant:

static bool
build_decode_table(u32 decode_table[],
		   const u8 lens[],
		   const unsigned num_syms,
		   const u32 decode_results[],
		   unsigned table_bits,
		   unsigned max_codeword_len,
		   u16 *sorted_syms,
		   unsigned *table_bits_ret)
{
	unsigned len_counts[DEFLATE_MAX_CODEWORD_LEN + 1];
	unsigned offsets[DEFLATE_MAX_CODEWORD_LEN + 1];
	unsigned sym;		/* current symbol */
	unsigned codeword;	/* current codeword, bit-reversed */
	unsigned len;		/* current codeword length in bits */
	unsigned count;		/* num codewords remaining with this length */
	u32 codespace_used;	/* codespace used out of '2^max_codeword_len' */
	unsigned cur_table_end; /* end index of current table */
	unsigned subtable_prefix; /* codeword prefix of current subtable */
	unsigned subtable_start;  /* start index of current subtable */
	unsigned subtable_bits;   /* log2 of current subtable length */

	/* Count how many codewords have each length, including 0. */
	for (len = 0; len <= max_codeword_len; len++)
		len_counts[len] = 0;
	for (sym = 0; sym < num_syms; sym++)
		len_counts[lens[sym]]++;

	/*
	 * Determine the actual maximum codeword length that was used, and
	 * decrease table_bits to it if allowed.
	 */
	while (max_codeword_len > 1 && len_counts[max_codeword_len] == 0)
		max_codeword_len--;
	if (table_bits_ret != NULL) {
		table_bits = MIN(table_bits, max_codeword_len);
		*table_bits_ret = table_bits;
	}

	/*
	 * Sort the symbols primarily by increasing codeword length and
	 * secondarily by increasing symbol value; or equivalently by their
	 * codewords in lexicographic order, since a canonical code is assumed.
	 *
	 * For efficiency, also compute 'codespace_used' in the same pass over
	 * 'len_counts[]' used to build 'offsets[]' for sorting.
	 */

	/* Ensure that 'codespace_used' cannot overflow. */
	STATIC_ASSERT(sizeof(codespace_used) == 4);
	STATIC_ASSERT(UINT32_MAX / (1U << (DEFLATE_MAX_CODEWORD_LEN - 1)) >=
		      DEFLATE_MAX_NUM_SYMS);

	offsets[0] = 0;
	offsets[1] = len_counts[0];
	codespace_used = 0;
	for (len = 1; len < max_codeword_len; len++) {
		offsets[len + 1] = offsets[len] + len_counts[len];
		codespace_used = (codespace_used << 1) + len_counts[len];
	}
	codespace_used = (codespace_used << 1) + len_counts[len];

	for (sym = 0; sym < num_syms; sym++)
		sorted_syms[offsets[lens[sym]]++] = sym;

	sorted_syms += offsets[0]; /* Skip unused symbols */

	/* lens[] is done being used, so we can write to decode_table[] now. */

	/*
	 * Check whether the lengths form a complete code (exactly fills the
	 * codespace), an incomplete code (doesn't fill the codespace), or an
	 * overfull code (overflows the codespace).  A codeword of length 'n'
	 * uses proportion '1/(2^n)' of the codespace.  An overfull code is
	 * nonsensical, so is considered invalid.  An incomplete code is
	 * considered valid only in two specific cases; see below.
	 */

	/* overfull code? */
	if (unlikely(codespace_used > (1U << max_codeword_len)))
		return false;

	/* incomplete code? */
	if (unlikely(codespace_used < (1U << max_codeword_len))) {
		u32 entry;
		unsigned i;

		/*
		 * The DEFLATE RFC explicitly allows the offset code to be
		 * incomplete in two cases: a code containing just 1 codeword,
		 * if that codeword has length 1; and a code containing no
		 * codewords.  Note: the list of offset codeword lengths is
		 * always nonempty, but lengths of 0 don't count as codewords.
		 *
		 * The RFC doesn't say whether the same cases are allowed for
		 * the litlen and pre codes.  It's actually impossible for no
		 * symbols to be used from these codes; however, it's
		 * technically possible for only one symbol to be used.  zlib
		 * allows 1 codeword for the litlen code, but not the precode.
		 * The RFC also doesn't say whether, when there is 1 codeword,
		 * that codeword is '0' or '1'.  zlib uses '0'.
		 *
		 * We accept what zlib accepts, plus a bit more.  First, we
		 * don't treat the precode more strictly than the litlen and
		 * offset codes.  There's no convincing reason to add a special
		 * case for the precode here.
		 *
		 * Second, we just map each allowed incompete code to a complete
		 * code with only real symbols.  To do this, we choose a symbol,
		 * either the used symbol (for codes with 1 codeword) or an
		 * arbitrary symbol (for empty codes), and give it both
		 * codewords '0' and '1'.  zlib instead uses a special ERROR
		 * symbol in the part of the codespace the code doesn't use.
		 * However, having an ERROR symbol reduces the performance of
		 * the Huffman decoder, for no real benefit.  Our approach also
		 * avoids having to decide whether '0' or '1' is correct.
		 *
		 * Like zlib, we still reject all incomplete codes that contain
		 * more than 1 codeword or a codeword length greater than 1.
		 */
		if (codespace_used == 0) {
			sym = 0; /* arbitrary */
		} else {
			if (codespace_used != (1U << (max_codeword_len - 1)) ||
			    len_counts[1] != 1)
				return false;
			sym = sorted_syms[0];
		}
		entry = make_decode_table_entry(decode_results, sym, 1);
		for (i = 0; i < (1U << table_bits); i++)
			decode_table[i] = entry;
		return true;
	}

	/*
	 * The lengths form a complete code.  Now, enumerate the codewords in
	 * lexicographic order and fill the decode table entries for each one.
	 *
	 * First, process all codewords with len <= table_bits.  Each one gets
	 * '2^(table_bits-len)' direct entries in the table.
	 *
	 * Since DEFLATE uses bit-reversed codewords, these entries aren't
	 * consecutive but rather are spaced '2^len' entries apart.  This makes
	 * filling them naively somewhat awkward and inefficient, since strided
	 * stores are less cache-friendly and preclude the use of word or
	 * vector-at-a-time stores to fill multiple entries per instruction.
	 *
	 * To optimize this, we incrementally double the table size.  When
	 * processing codewords with length 'len', the table is treated as
	 * having only '2^len' entries, so each codeword uses just one entry.
	 * Then, each time 'len' is incremented, the table size is doubled and
	 * the first half is copied to the second half.  This significantly
	 * improves performance over naively doing strided stores.
	 *
	 * Note that some entries copied for each table doubling may not have
	 * been initialized yet, but it doesn't matter since they're guaranteed
	 * to be initialized later (because the Huffman code is complete).
	 */
	codeword = 0;
	len = 1;
	while ((count = len_counts[len]) == 0)
		len++;
	cur_table_end = 1U << len;
	while (len <= table_bits) {
		/* Process all 'count' codewords with length 'len' bits. */
		do {
			unsigned bit;

			/* Fill the first entry for the current codeword. */
			decode_table[codeword] =
				make_decode_table_entry(decode_results,
							*sorted_syms++, len);

			if (codeword == cur_table_end - 1) {
				/* Last codeword (all 1's) */
				for (; len < table_bits; len++) {
					memcpy(&decode_table[cur_table_end],
					       decode_table,
					       cur_table_end *
						sizeof(decode_table[0]));
					cur_table_end <<= 1;
				}
				return true;
			}
			/*
			 * To advance to the lexicographically next codeword in
			 * the canonical code, the codeword must be incremented,
			 * then 0's must be appended to the codeword as needed
			 * to match the next codeword's length.
			 *
			 * Since the codeword is bit-reversed, appending 0's is
			 * a no-op.  However, incrementing it is nontrivial.  To
			 * do so efficiently, use the 'bsr' instruction to find
			 * the last (highest order) 0 bit in the codeword, set
			 * it, and clear any later (higher order) 1 bits.  But
			 * 'bsr' actually finds the highest order 1 bit, so to
			 * use it first flip all bits in the codeword by XOR'ing
			 * it with (1U << len) - 1 == cur_table_end - 1.
			 */
			bit = 1U << bsr32(codeword ^ (cur_table_end - 1));
			codeword &= bit - 1;
			codeword |= bit;
		} while (--count);

		/* Advance to the next codeword length. */
		do {
			if (++len <= table_bits) {
				memcpy(&decode_table[cur_table_end],
				       decode_table,
				       cur_table_end * sizeof(decode_table[0]));
				cur_table_end <<= 1;
			}
		} while ((count = len_counts[len]) == 0);
	}

	/* Process codewords with len > table_bits.  These require subtables. */
	cur_table_end = 1U << table_bits;
	subtable_prefix = -1;
	subtable_start = 0;
	for (;;) {
		u32 entry;
		unsigned i;
		unsigned stride;
		unsigned bit;

		/*
		 * Start a new subtable if the first 'table_bits' bits of the
		 * codeword don't match the prefix of the current subtable.
		 */
		if ((codeword & ((1U << table_bits) - 1)) != subtable_prefix) {
			subtable_prefix = (codeword & ((1U << table_bits) - 1));
			subtable_start = cur_table_end;
			/*
			 * Calculate the subtable length.  If the codeword has
			 * length 'table_bits + n', then the subtable needs
			 * '2^n' entries.  But it may need more; if fewer than
			 * '2^n' codewords of length 'table_bits + n' remain,
			 * then the length will need to be incremented to bring
			 * in longer codewords until the subtable can be
			 * completely filled.  Note that because the Huffman
			 * code is complete, it will always be possible to fill
			 * the subtable eventually.
			 */
			subtable_bits = len - table_bits;
			codespace_used = count;
			while (codespace_used < (1U << subtable_bits)) {
				subtable_bits++;
				codespace_used = (codespace_used << 1) +
					len_counts[table_bits + subtable_bits];
			}
			cur_table_end = subtable_start + (1U << subtable_bits);

			/*
			 * Create the entry that points from the main table to
			 * the subtable.
			 */
			decode_table[subtable_prefix] =
				((u32)subtable_start << 16) |
				HUFFDEC_EXCEPTIONAL |
				HUFFDEC_SUBTABLE_POINTER |
				(subtable_bits << 8) | table_bits;
		}

		/* Fill the subtable entries for the current codeword. */
		entry = make_decode_table_entry(decode_results, *sorted_syms++,
						len - table_bits);
		i = subtable_start + (codeword >> table_bits);
		stride = 1U << (len - table_bits);
		do {
			decode_table[i] = entry;
			i += stride;
		} while (i < cur_table_end);

		/* Advance to the next codeword. */
		if (codeword == (1U << len) - 1) /* last codeword (all 1's)? */
			return true;
		bit = 1U << bsr32(codeword ^ ((1U << len) - 1));
		codeword &= bit - 1;
		codeword |= bit;
		count--;
		while (count == 0)
			count = len_counts[++len];
	}
}